

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     add<true,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_short> destination,read_t<unsigned_short> source,Context *context)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  unsigned_short result;
  
  result = (*destination + source + 1) - (ushort)((context->flags).carry_ == 0);
  bVar3 = Numeric::carried_out<true,15,unsigned_short>(*destination,source,result);
  (context->flags).carry_ = (uint)bVar3;
  uVar1 = *destination;
  uVar2 = source ^ uVar1;
  (context->flags).auxiliary_carry_ = (ushort)((uVar2 ^ result) >> 4) & 1;
  (context->flags).overflow_ = (uint)(uVar1 ^ result) & ~(uint)uVar2 & 0x8000;
  Flags::
  set_from<unsigned_short,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,result);
  *destination = result;
  return;
}

Assistant:

void add(
	modify_t<IntT> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST + SRC [+ CF];
	*/
	/*
		The OF, SF, ZF, AF, CF, and PF flags are set according to the result.
	*/
	const IntT result = destination + source + (with_carry ? context.flags.template carry_bit<IntT>() : 0);

	context.flags.template set_from<Flag::Carry>(
		Numeric::carried_out<true, Numeric::bit_size<IntT>() - 1>(destination, source, result));
	context.flags.template set_from<Flag::AuxiliaryCarry>(
		Numeric::carried_in<4>(destination, source, result));
	context.flags.template set_from<Flag::Overflow>(
		Numeric::overflow<true, IntT>(destination, source, result));

	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(result);

	destination = result;
}